

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O1

void cppurses::detail::Screen::delegate_paint(Widget *widg,Screen_descriptor *staged_tiles)

{
  byte *pbVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  Glyph local_30;
  byte local_13 [3];
  
  Widget::generate_wallpaper(&local_30,widg);
  if ((widg->screen_state_).optimize.just_enabled == false) {
    if ((local_30.symbol != (widg->screen_state_).optimize.wallpaper.symbol) ||
       (bVar3 = operator==(&local_30.brush,&(widg->screen_state_).optimize.wallpaper.brush), !bVar3)
       ) {
      if ((local_30.symbol == L' ') && ((widg->screen_state_).optimize.wallpaper.symbol == L' ')) {
        local_13[0] = 2;
        local_13[1] = 3;
        local_13[2] = 5;
        uVar2 = (widg->screen_state_).optimize.wallpaper.brush.attributes_.super__Base_bitset<1UL>.
                _M_w;
        if ((char)(((uint)local_30.brush.attributes_.super__Base_bitset<1UL>._M_w & 4) >> 2) !=
            (char)(((uint)uVar2 & 4) >> 2)) {
          lVar5 = 1;
          do {
            if (lVar5 == 3) {
              bVar3 = (widg->screen_state_).optimize.wallpaper.brush.background_color_.initialized_;
              if (local_30.brush.background_color_.initialized_ == true) {
                bVar4 = bVar3 & *&(widg->screen_state_).optimize.wallpaper.brush.background_color_.
                                  storage_.data_ == local_30.brush.background_color_.storage_.data_;
              }
              else {
                bVar4 = bVar3 ^ 1;
              }
              if (bVar4 != 0) goto LAB_001513d6;
              break;
            }
            pbVar1 = local_13 + lVar5;
            lVar5 = lVar5 + 1;
          } while (((uVar2 >> (*pbVar1 & 0x3f) & 1) != 0) !=
                   (((ulong)local_30.brush.attributes_.super__Base_bitset<1UL>._M_w >>
                     (*pbVar1 & 0x3f) & 1) != 0));
        }
      }
      goto LAB_00151359;
    }
LAB_001513d6:
    if (((widg->screen_state_).optimize.moved == true) ||
       ((widg->screen_state_).optimize.resized != false)) goto LAB_00151359;
    if ((widg->screen_state_).optimize.child_event == true) {
      paint_empty_tiles(widg);
    }
    basic_paint(widg,staged_tiles);
  }
  else {
LAB_00151359:
    full_paint(widg,staged_tiles);
  }
  Screen_state::Optimize::reset(&(widg->screen_state_).optimize);
  (widg->screen_state_).optimize.wallpaper.symbol = local_30.symbol;
  (widg->screen_state_).optimize.wallpaper.brush.attributes_.super__Base_bitset<1UL>._M_w =
       (_WordT)local_30.brush.attributes_.super__Base_bitset<1UL>._M_w;
  bVar3 = (widg->screen_state_).optimize.wallpaper.brush.background_color_.initialized_;
  if (bVar3 == true) {
    if (local_30.brush.background_color_.initialized_ != false) {
      *&(widg->screen_state_).optimize.wallpaper.brush.background_color_.storage_.data_ =
           local_30.brush.background_color_.storage_.data_;
      goto LAB_0015143c;
    }
  }
  else if (local_30.brush.background_color_.initialized_ != false) {
    *&(widg->screen_state_).optimize.wallpaper.brush.background_color_.storage_.data_ =
         local_30.brush.background_color_.storage_.data_;
    (widg->screen_state_).optimize.wallpaper.brush.background_color_.initialized_ = true;
    goto LAB_0015143c;
  }
  if ((bVar3 != false) && (local_30.brush.background_color_.initialized_ == false)) {
    (widg->screen_state_).optimize.wallpaper.brush.background_color_.initialized_ = false;
  }
LAB_0015143c:
  bVar3 = (widg->screen_state_).optimize.wallpaper.brush.foreground_color_.initialized_;
  if (bVar3 == true) {
    if (local_30.brush.foreground_color_.initialized_ != false) {
      *&(widg->screen_state_).optimize.wallpaper.brush.foreground_color_.storage_.data_ =
           local_30.brush.foreground_color_.storage_.data_;
      return;
    }
  }
  else if (local_30.brush.foreground_color_.initialized_ != false) {
    *&(widg->screen_state_).optimize.wallpaper.brush.foreground_color_.storage_.data_ =
         local_30.brush.foreground_color_.storage_.data_;
    (widg->screen_state_).optimize.wallpaper.brush.foreground_color_.initialized_ = true;
    return;
  }
  if ((bVar3 != false) && (local_30.brush.foreground_color_.initialized_ == false)) {
    (widg->screen_state_).optimize.wallpaper.brush.foreground_color_.initialized_ = false;
  }
  return;
}

Assistant:

void Screen::delegate_paint(Widget& widg, const Screen_descriptor& staged_tiles)
{
    auto& optimization_info       = widg.screen_state().optimize;
    auto& previous_wallpaper      = optimization_info.wallpaper;
    const auto& current_wallpaper = widg.generate_wallpaper();
    if (optimization_info.just_enabled) {
        paint_just_enabled(widg, staged_tiles);
    }
    else if (!has_same_display(current_wallpaper, previous_wallpaper)) {
        full_paint(widg, staged_tiles);
    }
    else if (optimization_info.moved) {
        paint_move_event(widg, staged_tiles);
    }
    else if (optimization_info.resized) {
        // paint_resize_event(widg, staged_tiles);
        full_paint(widg, staged_tiles);
    }
    else if (optimization_info.child_event) {
        paint_child_event(widg, staged_tiles);
    }
    else {
        basic_paint(widg, staged_tiles);
    }
    optimization_info.reset();
    previous_wallpaper = current_wallpaper;
}